

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

pointer __thiscall QList<QDnsServiceRecord>::data(QList<QDnsServiceRecord> *this)

{
  QArrayDataPointer<QDnsServiceRecord> *this_00;
  QDnsServiceRecord *pQVar1;
  QArrayDataPointer<QDnsServiceRecord> *in_RDI;
  
  detach((QList<QDnsServiceRecord> *)0x3553cc);
  this_00 = (QArrayDataPointer<QDnsServiceRecord> *)
            QArrayDataPointer<QDnsServiceRecord>::operator->(in_RDI);
  pQVar1 = QArrayDataPointer<QDnsServiceRecord>::data(this_00);
  return pQVar1;
}

Assistant:

pointer data() { detach(); return d->data(); }